

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# timer.c
# Opt level: O1

void subr_copytimestats(LispPTR *args)

{
  uint uVar1;
  uint uVar2;
  long lVar3;
  DLword *pDVar4;
  DLword *pDVar5;
  byte bVar6;
  
  bVar6 = 0;
  uVar1 = *args;
  if ((uVar1 & 1) != 0) {
    printf("Misaligned pointer in NativeAligned4FromLAddr 0x%x\n",(ulong)uVar1);
  }
  pDVar4 = Lisp_world;
  uVar2 = args[1];
  if ((uVar2 & 1) != 0) {
    printf("Misaligned pointer in NativeAligned4FromLAddr 0x%x\n",(ulong)uVar2);
  }
  pDVar5 = Lisp_world + uVar2;
  update_miscstats();
  pDVar4 = pDVar4 + uVar1;
  for (lVar3 = 0x1f; lVar3 != 0; lVar3 = lVar3 + -1) {
    *(undefined4 *)pDVar5 = *(undefined4 *)pDVar4;
    pDVar4 = pDVar4 + (ulong)bVar6 * -4 + 2;
    pDVar5 = pDVar5 + (ulong)bVar6 * -4 + 2;
  }
  return;
}

Assistant:

void subr_copytimestats(LispPTR args[])
{
  MISCSTATS *source;
  MISCSTATS *dest;
  source = (MISCSTATS *)NativeAligned4FromLAddr(args[0]);
  dest = (MISCSTATS *)NativeAligned4FromLAddr(args[1]);
  update_miscstats();
  *dest = *source;
}